

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O3

void FACT_INTERNAL_ActivateEvent
               (FACTSoundInstance *sound,FACTTrack *track,FACTTrackInstance *trackInst,
               FACTEvent *evt,FACTEventInstance *evtInst,uint32_t elapsed)

{
  uint16_t uVar1;
  ushort uVar2;
  FACTWave *pFVar3;
  FACTEventInstance *pFVar4;
  FACTCue *pFVar5;
  FACTTrack *pFVar6;
  uint uVar7;
  FACTSound *pFVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  FACTTrackInstance *pFVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  switch(evt->type) {
  case 0:
    bVar9 = (evt->field_3).wave.flags;
    if ((bVar9 & 2) == 0) {
      pFVar3 = (trackInst->activeWave).wave;
      if (pFVar3 != (FACTWave *)0x0) {
        FACTWave_Stop(pFVar3,bVar9 & 1);
      }
      pFVar3 = (trackInst->upcomingWave).wave;
      if (pFVar3 != (FACTWave *)0x0) {
        FACTWave_Destroy(pFVar3);
        (trackInst->upcomingWave).wave = (FACTWave *)0x0;
      }
      bVar9 = track->eventCount;
      if (bVar9 != 0) {
        pFVar4 = trackInst->events;
        lVar10 = 0;
        do {
          *(undefined2 *)((long)&pFVar4->loopCount + lVar10) = 0;
          (&pFVar4->finished)[lVar10] = '\x01';
          lVar10 = lVar10 + 0xc;
        } while ((ulong)bVar9 * 0xc != lVar10);
      }
    }
    else {
      if ((bVar9 & 1) == 0) {
        pFVar5 = sound->parentCue;
        uVar1 = pFVar5->parentBank->cues[pFVar5->index].fadeOutMS;
        if (uVar1 != 0) {
          FACT_INTERNAL_BeginFadeOut(sound,uVar1);
          break;
        }
        if (pFVar5->maxRpcReleaseTime != 0) {
          FACT_INTERNAL_BeginReleaseRPC(sound,(uint16_t)pFVar5->maxRpcReleaseTime);
          break;
        }
      }
      pFVar8 = sound->sound;
      if (pFVar8->trackCount != '\0') {
        uVar11 = 0;
        do {
          pFVar6 = pFVar8->tracks;
          pFVar12 = sound->tracks;
          pFVar3 = pFVar12[uVar11].activeWave.wave;
          if (pFVar3 != (FACTWave *)0x0) {
            FACTWave_Stop(pFVar3,1);
          }
          pFVar12 = pFVar12 + uVar11;
          pFVar3 = (pFVar12->upcomingWave).wave;
          if (pFVar3 != (FACTWave *)0x0) {
            FACTWave_Destroy(pFVar3);
            (pFVar12->upcomingWave).wave = (FACTWave *)0x0;
          }
          bVar9 = pFVar6[uVar11].eventCount;
          if (bVar9 != 0) {
            pFVar4 = pFVar12->events;
            lVar10 = 0;
            do {
              *(undefined2 *)((long)&pFVar4->loopCount + lVar10) = 0;
              (&pFVar4->finished)[lVar10] = '\x01';
              lVar10 = lVar10 + 0xc;
            } while ((ulong)bVar9 * 0xc != lVar10);
          }
          uVar11 = uVar11 + 1;
          pFVar8 = sound->sound;
        } while (uVar11 < pFVar8->trackCount);
      }
    }
    break;
  case 1:
  case 3:
  case 4:
  case 6:
    SDL_memcpy(&trackInst->activeWave,&trackInst->upcomingWave,0x18);
    (trackInst->upcomingWave).wave = (FACTWave *)0x0;
    FACTWave_Play((trackInst->activeWave).wave);
    break;
  case 7:
  case 8:
  case 0x10:
  case 0x11:
    if (((evt->field_3).wave.flags & 1) == 0) {
      bVar9 = *(byte *)((long)&evt->field_3 + 8);
      if ((bVar9 & 4) == 0) {
        fVar14 = 0.0;
        if ((bVar9 & 8) != 0) {
          fVar14 = *(float *)((long)&evt->field_3 + 0xc);
          uVar7 = stb_rand();
          fVar14 = (*(float *)((long)&evt->field_3 + 0x10) - *(float *)((long)&evt->field_3 + 0xc))
                   * (float)((double)uVar7 * 2.3283064365386963e-10) + fVar14;
          bVar9 = *(byte *)((long)&evt->field_3 + 8);
        }
      }
      else {
        fVar14 = *(float *)((long)&evt->field_3 + 0xc);
      }
      bVar13 = true;
      if ((bVar9 & 1) != 0) {
        if ((evt->type == 0x10) || (evt->type == 7)) {
          fVar14 = fVar14 + trackInst->evtPitch;
        }
        else {
          fVar14 = fVar14 + trackInst->evtVolume;
        }
      }
    }
    else {
      uVar7 = (uint)*(ushort *)((long)&evt->field_3 + 0x14);
      fVar15 = (float)uVar7;
      bVar13 = evtInst->timestamp + uVar7 < elapsed;
      fVar14 = *(float *)((long)&evt->field_3 + 8);
      fVar17 = (float)(elapsed - evtInst->timestamp) / fVar15;
      fVar16 = 1.0;
      if (fVar17 <= 1.0) {
        fVar16 = fVar17;
      }
      fVar14 = fVar16 * ((((*(float *)((long)&evt->field_3 + 0xc) * fVar15) / 1000.0) * 10.0 +
                         fVar14) - fVar14) + fVar14;
    }
    (evtInst->field_3).value = fVar14;
    if ((evt->type == 0x10) || (evt->type == 7)) {
      trackInst->evtPitch = fVar14;
    }
    else {
      trackInst->evtVolume = fVar14;
    }
    if (!bVar13) {
      return;
    }
    uVar1 = evtInst->loopCount;
    if (uVar1 != 0) {
      if ((uVar1 != 0xff) && (uVar1 != 0xffff)) {
        evtInst->loopCount = uVar1 - 1;
      }
      uVar2 = (evt->field_3).wave.angle;
LAB_0010eed1:
      evtInst->timestamp = evtInst->timestamp + (uint)uVar2;
      return;
    }
    break;
  case 9:
  case 0x12:
    uVar1 = evtInst->loopCount;
    if (uVar1 != 0) {
      if (uVar1 != 0xff) {
        evtInst->loopCount = uVar1 - 1;
      }
      uVar2 = (evt->field_3).marker.frequency;
      goto LAB_0010eed1;
    }
  }
  evtInst->finished = '\x01';
  return;
}

Assistant:

void FACT_INTERNAL_ActivateEvent(
	FACTSoundInstance *sound,
	FACTTrack *track,
	FACTTrackInstance *trackInst,
	FACTEvent *evt,
	FACTEventInstance *evtInst,
	uint32_t elapsed
) {
	uint8_t i;
	float svResult;
	uint8_t skipLoopCheck = 0;

	/* STOP */
	if (evt->type == FACTEVENT_STOP)
	{
		/* Stop Cue */
		if (evt->stop.flags & 0x02)
		{
			if (	evt->stop.flags & 0x01 ||
				(	sound->parentCue->parentBank->cues[sound->parentCue->index].fadeOutMS == 0 &&
					sound->parentCue->maxRpcReleaseTime == 0	)	)
			{
				for (i = 0; i < sound->sound->trackCount; i += 1)
				{
					FACT_INTERNAL_StopTrack(
						&sound->sound->tracks[i],
						&sound->tracks[i],
						1
					);
				}
			}
			else
			{
				if (sound->parentCue->parentBank->cues[sound->parentCue->index].fadeOutMS > 0)
				{
					FACT_INTERNAL_BeginFadeOut(
						sound,
						sound->parentCue->parentBank->cues[sound->parentCue->index].fadeOutMS
					);
				}
				else if (sound->parentCue->maxRpcReleaseTime > 0)
				{
					FACT_INTERNAL_BeginReleaseRPC(
						sound,
						sound->parentCue->maxRpcReleaseTime
					);
				}
				else
				{
					/* Pretty sure this doesn't happen, but just in case? */
					sound->parentCue->state |= FACT_STATE_STOPPING;
				}
			}
		}

		/* Stop track */
		else
		{
			FACT_INTERNAL_StopTrack(
				track,
				trackInst,
				evt->stop.flags & 0x01
			);
		}
	}

	/* PLAYWAVE */
	else if (	evt->type == FACTEVENT_PLAYWAVE ||
			evt->type == FACTEVENT_PLAYWAVETRACKVARIATION ||
			evt->type == FACTEVENT_PLAYWAVEEFFECTVARIATION ||
			evt->type == FACTEVENT_PLAYWAVETRACKEFFECTVARIATION	)
	{
		FAudio_assert(trackInst->activeWave.wave == NULL);
		FAudio_assert(trackInst->upcomingWave.wave != NULL);
		FAudio_memcpy(
			&trackInst->activeWave,
			&trackInst->upcomingWave,
			sizeof(trackInst->activeWave)
		);
		trackInst->upcomingWave.wave = NULL;
		FACTWave_Play(trackInst->activeWave.wave);
	}

	/* SETVALUE */
	else if (	evt->type == FACTEVENT_PITCH ||
			evt->type == FACTEVENT_PITCHREPEATING ||
			evt->type == FACTEVENT_VOLUME ||
			evt->type == FACTEVENT_VOLUMEREPEATING	)
	{
		/* Ramp/Equation */
		if (evt->value.settings & 0x01)
		{
			/* FIXME: Incorporate 2nd derivative into the interpolated pitch (slopeDelta) */
			skipLoopCheck = elapsed <= (evtInst->timestamp + evt->value.ramp.duration);
			svResult = (
				evt->value.ramp.initialSlope *
				evt->value.ramp.duration / 1000 *
				10 /* "Slices" */
			) + evt->value.ramp.initialValue;
			svResult = (
				(svResult - evt->value.ramp.initialValue)
			) * FAudio_clamp(
				(float) (elapsed - evtInst->timestamp) / evt->value.ramp.duration,
				0.0f,
				1.0f
			) + evt->value.ramp.initialValue;

			evtInst->value = svResult;
		}
		else
		{
			/* Value/Random */
			if (evt->value.equation.flags & 0x04)
			{
				svResult = evt->value.equation.value1;
			}
			else if (evt->value.equation.flags & 0x08)
			{
				svResult = evt->value.equation.value1 + FACT_INTERNAL_rng() * (
					evt->value.equation.value2 -
					evt->value.equation.value1
				);
			}
			else
			{
				svResult = 0.0f;
				FAudio_assert(0 && "Equation flags?");
			}

			/* Add/Replace */
			if (evt->value.equation.flags & 0x01)
			{
				if(	evt->type == FACTEVENT_PITCH ||
					evt->type == FACTEVENT_PITCHREPEATING	)
				{
					evtInst->value = trackInst->evtPitch + svResult;
				}
				else
				{
					evtInst->value = trackInst->evtVolume + svResult;
				}
			}
			else
			{
				evtInst->value = svResult;
			}
		}

		/* Set the result, finally. */
		if (	evt->type == FACTEVENT_PITCH ||
			evt->type == FACTEVENT_PITCHREPEATING	)
		{
			trackInst->evtPitch = evtInst->value;
		}
		else
		{
			trackInst->evtVolume = evtInst->value;
		}

		if (skipLoopCheck)
		{
			return;
		}
		if (evtInst->loopCount > 0)
		{
			if (evtInst->loopCount != 0xFF && evtInst->loopCount != 0xFFFF)
			{
				evtInst->loopCount -= 1;
			}

			evtInst->timestamp += evt->value.frequency;
			return;
		}
	}

	/* MARKER */
	else if (	evt->type == FACTEVENT_MARKER ||
			evt->type == FACTEVENT_MARKERREPEATING	)
	{
		/* TODO: FACT_INTERNAL_Marker(evt->marker*) */
		if (evtInst->loopCount > 0)
		{
			if (evtInst->loopCount != 0xFF)
			{
				evtInst->loopCount -= 1;
			}

			evtInst->timestamp += evt->marker.frequency;
			return;
		}
	}

	/* ??? */
	else
	{
		FAudio_assert(0 && "Unknown event type!");
	}

	/* If we made it here, we're done! */
	evtInst->finished = 1;
}